

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetRepeatedString
          (Reflection *this,Message *message,FieldDescriptor *field,int index,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  int number;
  uint32 uVar3;
  string *this_00;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  FieldDescriptor *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedString","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedString",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_30 = FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_30,&local_38);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetRepeatedString",CPPTYPE_STRING);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar2 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    local_58 = (size_type *)(value->_M_dataplus)._M_p;
    paVar1 = &value->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58 == paVar1) {
      local_48 = paVar1->_M_allocated_capacity;
      uStack_40 = *(undefined8 *)((long)&value->field_2 + 8);
      local_58 = &local_48;
    }
    else {
      local_48 = paVar1->_M_allocated_capacity;
    }
    local_50 = value->_M_string_length;
    (value->_M_dataplus)._M_p = (pointer)paVar1;
    value->_M_string_length = 0;
    (value->field_2)._M_local_buf[0] = '\0';
    this_00 = internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                         number,index);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
  }
  else {
    uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    std::__cxx11::string::operator=
              (*(string **)
                (*(long *)((long)&message[2].super_MessageLite._vptr_MessageLite + (ulong)uVar3) + 8
                + (long)index * 8),(string *)value);
  }
  return;
}

Assistant:

void Reflection::SetRepeatedString(Message* message,
                                   const FieldDescriptor* field, int index,
                                   std::string value) const {
  USAGE_CHECK_ALL(SetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedString(field->number(), index,
                                                    std::move(value));
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        MutableRepeatedField<std::string>(message, field, index)->assign(std::move(value));
        break;
    }
  }
}